

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O0

int fs_rename(char *oldname,char *newname)

{
  int iVar1;
  char *in_RSI;
  char *in_RDI;
  uint local_4;
  
  iVar1 = rename(in_RDI,in_RSI);
  local_4 = (uint)(iVar1 != 0);
  return local_4;
}

Assistant:

int fs_rename(const char *oldname, const char *newname)
{
#if defined(CONF_FAMILY_WINDOWS)
	WCHAR wOldname[IO_MAX_PATH_LENGTH];
	WCHAR wNewname[IO_MAX_PATH_LENGTH];
	MultiByteToWideChar(CP_UTF8, 0, oldname, -1, wOldname, sizeof(wOldname) / sizeof(WCHAR));
	MultiByteToWideChar(CP_UTF8, 0, newname, -1, wNewname, sizeof(wNewname) / sizeof(WCHAR));
	if(MoveFileExW(wOldname, wNewname, MOVEFILE_REPLACE_EXISTING | MOVEFILE_COPY_ALLOWED) == 0)
		return 1;
	return 0;
#else
	if(rename(oldname, newname))
		return 1;
	return 0;
#endif
}